

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-display.c
# Opt level: O1

void see_floor_items(game_event_type type,game_event_data *data,void *user)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  _Bool _Var4;
  wchar_t floor_num;
  object **items;
  char *pcVar5;
  char *pcVar6;
  ulong uVar7;
  ui_event uVar8;
  char o_name [80];
  ui_event local_88 [7];
  
  uVar1 = z_info->floor_size;
  items = (object **)mem_zalloc((ulong)((uint)uVar1 * 8));
  _Var3 = true;
  if (player->timed[2] == 0) {
    _Var3 = no_light(player);
  }
  floor_num = scan_floor(items,(uint)uVar1,player,OFLOOR_VISIBLE|OFLOOR_SENSE,(item_tester)0x0);
  if (floor_num != L'\0') {
    if (floor_num < L'\x01') {
      bVar2 = false;
    }
    else {
      uVar7 = 0;
      bVar2 = false;
      do {
        _Var4 = inven_carry_okay(items[uVar7]);
        if (_Var4) {
          bVar2 = true;
        }
        uVar7 = uVar7 + 1;
      } while ((uint)floor_num != uVar7);
    }
    if (floor_num == L'\x01') {
      pcVar5 = "see";
      if (_Var3 != false) {
        pcVar5 = "feel";
      }
      pcVar6 = "have no room for";
      if (bVar2) {
        pcVar6 = pcVar5;
      }
      object_desc((char *)&local_88[0].type,0x50,*items,
                  (uint)(_Var3 ^ 1U) + (uint)(_Var3 ^ 1U) * 2 + 0x40,player);
      event_signal(EVENT_MESSAGE_FLUSH);
      msg("You %s %s.",pcVar6,local_88);
    }
    else {
      screen_save();
      show_floor(items,floor_num,L'\b',(item_tester)0x0);
      pcVar5 = format("You %s: ");
      prt(pcVar5,L'\0',L'\0');
      uVar8 = inkey_ex();
      local_88[0]._0_8_ = uVar8.mouse;
      local_88[0]._8_1_ = uVar8.key.mods;
      Term_event_push(local_88);
      screen_load();
    }
  }
  mem_free(items);
  return;
}

Assistant:

static void see_floor_items(game_event_type type, game_event_data *data,
							void *user)
{
	int floor_max = z_info->floor_size;
	struct object **floor_list = mem_zalloc(floor_max * sizeof(*floor_list));
	int floor_num = 0;
	bool blind = ((player->timed[TMD_BLIND]) || (no_light(player)));

	const char *p = "see";
	bool can_pickup = false;
	int i;

	/* Scan all visible, sensed objects in the grid */
	floor_num = scan_floor(floor_list, floor_max, player,
		OFLOOR_SENSE | OFLOOR_VISIBLE, NULL);
	if (floor_num == 0) {
		mem_free(floor_list);
		return;
	}

	/* Can we pick any up? */
	for (i = 0; i < floor_num; i++)
	    if (inven_carry_okay(floor_list[i]))
			can_pickup = true;

	/* One object */
	if (floor_num == 1) {
		/* Get the object */
		struct object *obj = floor_list[0];
		char o_name[80];

		if (!can_pickup)
			p = "have no room for";
		else if (blind)
			p = "feel";

		/* Describe the object.  Less detail if blind. */
		if (blind) {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_BASE, player);
		} else {
			object_desc(o_name, sizeof(o_name), obj,
				ODESC_PREFIX | ODESC_FULL, player);
		}

		/* Message */
		event_signal(EVENT_MESSAGE_FLUSH);
		msg("You %s %s.", p, o_name);
	} else {
		ui_event e;

		if (!can_pickup)
			p = "have no room for the following objects";
		else if (blind)
			p = "feel something on the floor";

		/* Display objects on the floor */
		screen_save();
		show_floor(floor_list, floor_num, OLIST_WEIGHT, NULL);
		prt(format("You %s: ", p), 0, 0);

		/* Wait for it.  Use key as next command. */
		e = inkey_ex();
		Term_event_push(&e);

		/* Restore screen */
		screen_load();
	}

	mem_free(floor_list);
}